

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

internalJSONNode * internalJSONNode::newInternal(json_string *name_t,json_string *value_t)

{
  internalJSONNode *this;
  
  this = (internalJSONNode *)operator_new(0x78);
  internalJSONNode(this,name_t,value_t);
  return this;
}

Assistant:

internalJSONNode * internalJSONNode::newInternal(const json_string & name_t, const json_string & value_t) {
	#ifdef JSON_MEMORY_POOL /*-> JSON_MEMORY_POOL */
		return new((internalJSONNode*)json_internal_mempool.allocate()) internalJSONNode(name_t, value_t);
	#elif defined(JSON_MEMORY_CALLBACKS) /*<- else JSON_MEMORY_CALLBACKS */
		return new(json_malloc<internalJSONNode>(1)) internalJSONNode(name_t, value_t);
	#else /*<- else */
		return new internalJSONNode(name_t, value_t);
	#endif /*<- */
}